

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O1

plutovg_surface_t * plutovg_surface_load_from_image_base64(char *data,int length)

{
  byte bVar1;
  size_t sVar2;
  void *data_00;
  plutovg_surface_t *ppVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  
  if (length == -1) {
    sVar2 = strlen(data);
    length = (int)sVar2;
  }
  data_00 = malloc((long)length);
  if (data_00 == (void *)0x0) {
    return (plutovg_surface_t *)0x0;
  }
  if (length < 1) {
    iVar7 = 2;
    lVar5 = 0;
    bVar9 = false;
  }
  else {
    uVar4 = 0;
    uVar6 = 0;
    lVar5 = 0;
    do {
      bVar1 = data[uVar4];
      uVar8 = (ulong)bVar1;
      if (uVar8 == 0x3d) {
        uVar6 = uVar6 + 1;
LAB_0011437e:
        iVar7 = 0;
        bVar9 = true;
      }
      else if ((((byte)(bVar1 - 0x30) < 10) || ((bVar1 & 0xfb) == 0x2b)) ||
              ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
        iVar7 = 0;
        if (uVar6 == 0) {
          *(uint8_t *)((long)data_00 + lVar5) = ""[uVar8];
          lVar5 = lVar5 + 1;
          bVar9 = true;
          uVar6 = 0;
        }
        else {
          iVar7 = 5;
          bVar9 = false;
        }
      }
      else {
        iVar7 = 5;
        bVar9 = false;
        if ((bVar1 < 0x21) && (bVar9 = false, (0x100002600U >> (uVar8 & 0x3f) & 1) != 0))
        goto LAB_0011437e;
      }
      if (!bVar9) goto LAB_001143d0;
      uVar4 = uVar4 + 1;
    } while ((uint)length != uVar4);
    iVar7 = 2;
LAB_001143d0:
    bVar9 = 2 < uVar6;
  }
  if (iVar7 != 5) {
    if (iVar7 != 2) {
      return (plutovg_surface_t *)data;
    }
    ppVar3 = (plutovg_surface_t *)0x0;
    if ((((uint)lVar5 & 3) == 1) || (lVar5 == 0 || bVar9)) goto LAB_0011440d;
    uVar4 = lVar5 - (lVar5 + 3U >> 2);
    if (uVar4 != 0) {
      if ((uVar4 < 2) || (uVar4 == 2)) {
        lVar5 = 0;
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        lVar5 = 0;
        do {
          *(byte *)((long)data_00 + uVar6) =
               *(byte *)((long)data_00 + lVar5 + 1) >> 4 & 3 | *(char *)((long)data_00 + lVar5) << 2
          ;
          *(byte *)((long)data_00 + uVar6 + 1) =
               *(byte *)((long)data_00 + lVar5 + 2) >> 2 & 0xf |
               *(char *)((long)data_00 + lVar5 + 1) << 4;
          *(byte *)((long)data_00 + uVar6 + 2) =
               *(byte *)((long)data_00 + lVar5 + 3) & 0x3f |
               *(char *)((long)data_00 + lVar5 + 2) << 6;
          lVar5 = lVar5 + 4;
          uVar6 = uVar6 + 3;
        } while (uVar6 < uVar4 - 2);
      }
      if (uVar6 < uVar4) {
        *(byte *)((long)data_00 + uVar6) =
             *(byte *)((long)data_00 + lVar5 + 1) >> 4 & 3 | *(char *)((long)data_00 + lVar5) << 2;
      }
      if (uVar6 + 1 < uVar4) {
        *(byte *)((long)data_00 + uVar6 + 1) =
             *(byte *)((long)data_00 + lVar5 + 2) >> 2 & 0xf |
             *(char *)((long)data_00 + lVar5 + 1) << 4;
      }
      ppVar3 = plutovg_surface_load_from_image_data(data_00,(int)uVar4);
      goto LAB_0011440d;
    }
  }
  ppVar3 = (plutovg_surface_t *)0x0;
LAB_0011440d:
  free(data_00);
  return ppVar3;
}

Assistant:

plutovg_surface_t* plutovg_surface_load_from_image_base64(const char* data, int length)
{
    plutovg_surface_t* surface = NULL;
    uint8_t* output_data = NULL;
    size_t output_length = 0;

    size_t equals_sign_count = 0;
    size_t sidx = 0;
    size_t didx = 0;

    if(length == -1)
        length = strlen(data);
    output_data = malloc(length);
    if(output_data == NULL)
        return NULL;
    for(int i = 0; i < length; ++i) {
        uint8_t cc = data[i];
        if(cc == '=') {
            ++equals_sign_count;
        } else if(cc == '+' || cc == '/' || PLUTOVG_IS_ALNUM(cc)) {
            if(equals_sign_count > 0)
                goto cleanup;
            output_data[output_length++] = base64_table[cc];
        } else if(!PLUTOVG_IS_WS(cc)) {
            goto cleanup;
        }
    }

    if(output_length == 0 || equals_sign_count > 2 || (output_length % 4) == 1)
        goto cleanup;
    output_length -= (output_length + 3) / 4;
    if(output_length == 0) {
        goto cleanup;
    }

    if(output_length > 1) {
        while(didx < output_length - 2) {
            output_data[didx + 0] = (((output_data[sidx + 0] << 2) & 255) | ((output_data[sidx + 1] >> 4) & 003));
            output_data[didx + 1] = (((output_data[sidx + 1] << 4) & 255) | ((output_data[sidx + 2] >> 2) & 017));
            output_data[didx + 2] = (((output_data[sidx + 2] << 6) & 255) | ((output_data[sidx + 3] >> 0) & 077));
            sidx += 4;
            didx += 3;
        }
    }

    if(didx < output_length)
        output_data[didx] = (((output_data[sidx + 0] << 2) & 255) | ((output_data[sidx + 1] >> 4) & 003));
    if(++didx < output_length) {
        output_data[didx] = (((output_data[sidx + 1] << 4) & 255) | ((output_data[sidx + 2] >> 2) & 017));
    }

    surface = plutovg_surface_load_from_image_data(output_data, output_length);
cleanup:
    free(output_data);
    return surface;
}